

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetApproximateQuantileAggregateFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType LVar1;
  char cVar2;
  AggregateFunction *pAVar3;
  InternalException *this;
  LogicalType *in_RCX;
  LogicalType *return_type;
  uint *return_type_00;
  LogicalType *this_00;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  LogicalType local_1a8 [24];
  undefined1 local_190 [48];
  undefined1 local_160 [72];
  LogicalType local_118 [24];
  undefined1 local_100 [48];
  undefined1 local_d0 [48];
  undefined1 local_a0 [48];
  undefined1 local_70 [48];
  
  duckdb::LogicalType::LogicalType((LogicalType *)local_1c8,TIME_TZ);
  cVar2 = duckdb::LogicalType::operator==(type,(LogicalType *)local_1c8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1c8);
  if (cVar2 == '\0') {
    LVar1 = type[1];
    return_type = (LogicalType *)(ulong)(byte)LVar1;
    return_type_00 = &switchD_004bfe93::switchdataD_00774e38;
    switch(LVar1) {
    case (LogicalType)0x3:
      pAVar3 = (AggregateFunction *)local_70;
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = (LogicalType *)(local_a0 + 0x18);
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,signed_char,signed_char,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,(LogicalType *)return_type_00);
      break;
    case (LogicalType)0x4:
    case (LogicalType)0x6:
    case (LogicalType)0x8:
    case (LogicalType)0xa:
switchD_004bfe93_caseD_4:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Unimplemented quantile aggregate","");
      duckdb::InternalException::InternalException(this,(string *)local_1c8);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    case (LogicalType)0x5:
      pAVar3 = (AggregateFunction *)local_a0;
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = (LogicalType *)(local_d0 + 0x18);
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,short,short,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,(LogicalType *)return_type_00);
      break;
    case (LogicalType)0x7:
      pAVar3 = (AggregateFunction *)local_d0;
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = (LogicalType *)(local_100 + 0x18);
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,int,int,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,(LogicalType *)return_type_00);
      break;
    case (LogicalType)0x9:
      pAVar3 = (AggregateFunction *)local_100;
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = local_118;
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,long,long,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,(LogicalType *)return_type_00);
      break;
    case (LogicalType)0xb:
      pAVar3 = (AggregateFunction *)local_160;
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = (LogicalType *)(local_190 + 0x18);
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,float,float,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,(LogicalType *)return_type_00);
      break;
    case (LogicalType)0xc:
      pAVar3 = (AggregateFunction *)local_190;
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = local_1a8;
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,double,double,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,(LogicalType *)return_type_00);
      break;
    default:
      if (LVar1 != (LogicalType)0xcc) goto switchD_004bfe93_caseD_4;
      pAVar3 = (AggregateFunction *)(local_160 + 0x30);
      duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
      this_00 = (LogicalType *)(local_160 + 0x18);
      duckdb::LogicalType::LogicalType(this_00,type);
      AggregateFunction::
      UnaryAggregateDestructor<duckdb::ApproxQuantileState,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
                (__return_storage_ptr__,pAVar3,this_00,return_type);
    }
  }
  else {
    pAVar3 = (AggregateFunction *)&stack0xffffffffffffffc0;
    duckdb::LogicalType::LogicalType((LogicalType *)pAVar3,type);
    this_00 = (LogicalType *)(local_70 + 0x18);
    duckdb::LogicalType::LogicalType(this_00,type);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ApproxQuantileState,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::ApproxQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,pAVar3,this_00,in_RCX);
  }
  duckdb::LogicalType::~LogicalType(this_00);
  pAVar3 = (AggregateFunction *)duckdb::LogicalType::~LogicalType((LogicalType *)pAVar3);
  return pAVar3;
}

Assistant:

static AggregateFunction GetApproximateQuantileAggregateFunction(const LogicalType &type) {
	//	Not binary comparable
	if (type == LogicalType::TIME_TZ) {
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, dtime_tz_t, dtime_tz_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	}
	switch (type.InternalType()) {
	case PhysicalType::INT8:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int8_t, int8_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT16:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int16_t, int16_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT32:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int32_t, int32_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT64:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, int64_t, int64_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::INT128:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, hugeint_t, hugeint_t,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::FLOAT:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, float, float,
		                                                   ApproxQuantileScalarOperation>(type, type);
	case PhysicalType::DOUBLE:
		return AggregateFunction::UnaryAggregateDestructor<ApproxQuantileState, double, double,
		                                                   ApproxQuantileScalarOperation>(type, type);
	default:
		throw InternalException("Unimplemented quantile aggregate");
	}
}